

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Indexer.cpp
# Opt level: O2

void __thiscall Indexer::register_dataset(Indexer *this,string *dataset_name)

{
  std::
  make_unique<OnDiskDataset,std::experimental::filesystem::v1::__cxx11::path_const&,std::__cxx11::string_const&>
            ((path *)&stack0xffffffffffffffe8,&(this->snap->db_base)._M_pathname);
  std::
  vector<std::unique_ptr<OnDiskDataset,std::default_delete<OnDiskDataset>>,std::allocator<std::unique_ptr<OnDiskDataset,std::default_delete<OnDiskDataset>>>>
  ::emplace_back<std::unique_ptr<OnDiskDataset,std::default_delete<OnDiskDataset>>>
            ((vector<std::unique_ptr<OnDiskDataset,std::default_delete<OnDiskDataset>>,std::allocator<std::unique_ptr<OnDiskDataset,std::default_delete<OnDiskDataset>>>>
              *)&this->created_datasets,
             (unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_> *)
             &stack0xffffffffffffffe8);
  std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>::~unique_ptr
            ((unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_> *)
             &stack0xffffffffffffffe8);
  return;
}

Assistant:

void Indexer::register_dataset(const std::string &dataset_name) {
    created_datasets.emplace_back(
        std::make_unique<OnDiskDataset>(snap->db_base, dataset_name));
}